

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

ValueType ValueType::FromObject(RecyclableObject *recyclableObject)

{
  TypeId typeId;
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  ObjectType OVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  ulong uVar6;
  undefined8 uStack_28;
  ValueType valueType;
  
  uStack_28 = in_RAX;
  if (recyclableObject == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x543,"(recyclableObject)","recyclableObject");
    if (!bVar2) goto LAB_009f46bc;
    *puVar5 = 0;
  }
  typeId = ((recyclableObject->type).ptr)->typeId;
  uVar6 = (ulong)typeId;
  if ((uVar6 < 0x58) && (TypeIdToBits[uVar6] != 0)) {
    aVar3.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         Verify(TypeIdToBits[uVar6]);
    uStack_28 = CONCAT26(aVar3.bits,(undefined6)uStack_28);
    bVar2 = IsLikelyOptimizedTypedArray((ValueType *)((long)&uStack_28 + 6));
    if ((!bVar2) ||
       ((recyclableObject->super_FinalizableObject).super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject != (_func_int **)TypeIdToVtable[uVar6])) {
      return (anon_union_2_4_ea848c7b_for_ValueType_13)
             (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
    }
    OVar4 = GetObjectType((ValueType *)((long)&uStack_28 + 6));
    OVar4 = VirtualTypedArrayPair[OVar4];
  }
  else {
    bVar2 = Js::DynamicType::Is(typeId);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x553,"(DynamicType::Is(typeId))","DynamicType::Is(typeId)");
      if (!bVar2) {
LAB_009f46bc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    bVar2 = Js::JavascriptArray::IsNonES5Array(typeId);
    if (bVar2) {
      aVar3.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           FromArray(Array,(JavascriptArray *)recyclableObject,typeId);
      return (anon_union_2_4_ea848c7b_for_ValueType_13)
             (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
    }
    if ((recyclableObject->super_FinalizableObject).super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject == (_func_int **)VirtualTableInfo<Js::DynamicObject>::Address)
    {
      bVar2 = Js::DynamicObject::HasObjectArray((DynamicObject *)recyclableObject);
      if (bVar2) {
        aVar3.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             FromObjectWithArray((DynamicObject *)recyclableObject);
        return (anon_union_2_4_ea848c7b_for_ValueType_13)
               (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
      }
    }
    OVar4 = Object;
  }
  aVar3.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)GetObject(OVar4);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
}

Assistant:

ValueType ValueType::FromObject(Js::RecyclableObject *const recyclableObject)
{
    using namespace Js;
    Assert(recyclableObject);
    const TypeId typeId = recyclableObject->GetTypeId();
    if (typeId < _countof(TypeIdToBits))
    {
        const Bits bits = TypeIdToBits[typeId];
        if (!!bits)
        {
            const ValueType valueType = Verify(bits);
            if (!valueType.IsLikelyOptimizedTypedArray())
                return valueType;
            bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(recyclableObject) == ValueType::GetVirtualTypedArrayVtable(typeId));
            if (!isVirtual)
                return valueType;
            return GetObject(VirtualTypedArrayPair[static_cast<uint16>(valueType.GetObjectType())]);
        }
    }
    Assert(DynamicType::Is(typeId)); // all static type IDs have nonzero values in TypeIdToBits

    if(!JavascriptArray::IsNonES5Array(typeId))
    {
        // TODO: Once the issue with loop bodies and uninitialized interpreter local slots is fixed, use FromVar
        DynamicObject *const object = static_cast<DynamicObject *>(recyclableObject);
        if(!VirtualTableInfo<DynamicObject>::HasVirtualTable(object) || !object->HasObjectArray())
            return GetObject(ObjectType::Object);
        return FromObjectWithArray(object);
    }

    return FromArray(ObjectType::Array, static_cast<JavascriptArray *>(recyclableObject), typeId);
}